

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenArrayCopySetSrcRef(BinaryenExpressionRef expr,BinaryenExpressionRef srcRefExpr)

{
  if (expr->_id != ArrayCopyId) {
    __assert_fail("expression->is<ArrayCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1173,
                  "void BinaryenArrayCopySetSrcRef(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (srcRefExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = srcRefExpr;
    return;
  }
  __assert_fail("srcRefExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1174,
                "void BinaryenArrayCopySetSrcRef(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayCopySetSrcRef(BinaryenExpressionRef expr,
                                BinaryenExpressionRef srcRefExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayCopy>());
  assert(srcRefExpr);
  static_cast<ArrayCopy*>(expression)->srcRef = (Expression*)srcRefExpr;
}